

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O2

void __thiscall PointAccessors::test_method(PointAccessors *this)

{
  bool bVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar2;
  Scalar local_560 [2];
  shared_count sStack_550;
  undefined1 local_548 [24];
  char *local_530;
  char *local_528;
  VectorXd v;
  RealScalar local_510;
  Matrix<double,_2,_1,_0,_2,_1> local_508;
  Matrix<double,_3,_1,_0,_3,_1> local_4f8;
  undefined **local_4d8;
  undefined1 local_4d0;
  undefined8 *local_4c8;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  Scalar local_418 [3];
  void *local_400;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  Point x;
  undefined1 local_2d0 [272];
  RealSpace R2;
  RealSpace R3;
  CartesianProduct S;
  
  mnf::RealSpace::RealSpace(&R3,3);
  local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       2.0;
  local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       3.0;
  mnf::RealSpace::RealSpace(&R2,2);
  local_508.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       10.0;
  local_508.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       20.0;
  _x = 5;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&v,(int *)&x);
  local_418[0] = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,&v,local_418);
  _S = 0x4000000000000000;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(Scalar *)&S);
  local_4d8 = (undefined **)0x4008000000000000;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar2,(Scalar *)&local_4d8);
  local_560[0] = 10.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar2,local_560);
  local_548._0_8_ = 20.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar2,(Scalar *)local_548);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x);
  mnf::CartesianProduct::CartesianProduct(&S,(Manifold *)&R3,(Manifold *)&R2);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)local_418,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v,(type *)0x0);
  mnf::Manifold::createPoint((Ref *)&x);
  free(local_400);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f8,0x4e);
  mnf::SubPoint::operator()((SubPoint *)local_418,(ulong)local_2d0);
  mnf::SubPoint::value();
  local_510 = 1e-12;
  bVar1 = Eigen::internal::
          isApprox_selector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_false>
          ::run(&local_4f8,
                (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)local_548,
                &local_510);
  local_560[1] = 0.0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_530 = "v3.isApprox(x(0).value())";
  local_528 = "";
  local_4d0 = 0;
  local_4d8 = &PTR__lazy_ostream_0013ec40;
  local_4c8 = &boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_420 = "";
  local_4c0 = (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&local_530;
  local_560[0]._0_1_ = bVar1;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)local_418);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_438,0x4f);
  mnf::SubPoint::operator()((SubPoint *)local_418,(ulong)local_2d0);
  mnf::SubPoint::value();
  local_510 = 1e-12;
  local_560[0]._0_1_ =
       Eigen::internal::
       isApprox_selector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_false>
       ::run(&local_508,
             (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)local_548,
             &local_510);
  local_560[1] = 0.0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_530 = "v2.isApprox(x(1).value())";
  local_528 = "";
  local_4d0 = 0;
  local_4d8 = &PTR__lazy_ostream_0013ec40;
  local_4c8 = &boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_450 = "";
  local_4c0 = (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)local_418);
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_468,0x50);
  mnf::SubPoint::operator[]((ulong)local_418);
  local_530 = (char *)0x3d719799812dea11;
  local_560[0]._0_1_ =
       Eigen::internal::
       isApprox_selector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1,_1,_false>,_false>
       ::run(&local_4f8,
             (Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
              *)local_418,(RealScalar *)&local_530);
  local_560[1] = 0.0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548._0_8_ = "v3.isApprox(x[0])";
  local_548._8_8_ = "";
  local_4d0 = 0;
  local_4d8 = &PTR__lazy_ostream_0013ec40;
  local_4c8 = &boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_480 = "";
  local_4c0 = (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)local_548;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_498,0x51);
  mnf::SubPoint::operator[]((ulong)local_418);
  local_530 = (char *)0x3d719799812dea11;
  bVar1 = Eigen::internal::
          isApprox_selector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1,_1,_false>,_false>
          ::run(&local_508,
                (Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
                 *)local_418,(RealScalar *)&local_530);
  local_560[0] = (Scalar)CONCAT71(local_560[0]._1_7_,bVar1);
  local_560[1] = 0.0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548._0_8_ = "v2.isApprox(x[1])";
  local_548._8_8_ = "";
  local_4d0 = 0;
  local_4d8 = &PTR__lazy_ostream_0013ec40;
  local_4c8 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_4b0 = "";
  local_4c0 = (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)local_548;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  mnf::Point::~Point(&x);
  mnf::CartesianProduct::~CartesianProduct(&S);
  free(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  mnf::RealSpace::~RealSpace(&R2);
  mnf::RealSpace::~RealSpace(&R3);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointAccessors)
{
  RealSpace R3(3);
  Eigen::Vector3d v3(1, 2, 3);
  RealSpace R2(2);
  Eigen::Vector2d v2(10, 20);
  Eigen::VectorXd v(5);
  v << 1, 2, 3, 10, 20;
  CartesianProduct S(R3, R2);
  Point x = S.createPoint(v);
  BOOST_CHECK(v3.isApprox(x(0).value()));
  BOOST_CHECK(v2.isApprox(x(1).value()));
  BOOST_CHECK(v3.isApprox(x[0]));
  BOOST_CHECK(v2.isApprox(x[1]));
}